

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.h
# Opt level: O2

void __thiscall SynBase::SynBase(SynBase *this,uint typeID,Lexeme *begin,Lexeme *end)

{
  char *strEnd;
  char *strBegin;
  
  this->_vptr_SynBase = (_func_int **)&PTR__SynBase_002222e8;
  this->typeID = typeID;
  this->begin = begin;
  this->end = end;
  if (begin == (Lexeme *)0x0) {
    strBegin = (char *)0x0;
  }
  else {
    strBegin = begin->pos;
  }
  if (end == (Lexeme *)0x0) {
    strEnd = (char *)0x0;
  }
  else {
    strEnd = end->pos + end->length;
  }
  InplaceStr::InplaceStr(&this->pos,strBegin,strEnd);
  this->next = (SynBase *)0x0;
  this->listed = false;
  this->isInternal = false;
  return;
}

Assistant:

SynBase(unsigned typeID, Lexeme *begin, Lexeme *end): typeID(typeID), begin(begin), end(end), pos(begin ? begin->pos : 0, end ? end->pos + end->length : 0), next(0), listed(false), isInternal(false)
	{
	}